

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCArray NULLC::LongToStr(longlong *r)

{
  char **ppcVar1;
  int iVar2;
  bool bVar3;
  NULLCArray NVar4;
  char *local_88;
  char *str;
  uint local_78;
  char **local_60;
  char *curr;
  char buf [32];
  long lStack_28;
  bool sign;
  longlong number;
  longlong *r_local;
  NULLCArray arr;
  
  memset((void *)((long)&r_local + 4),0,0xc);
  if (r == (longlong *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    lStack_28 = *r;
    bVar3 = lStack_28 < 0;
    iVar2 = (int)(lStack_28 % 10);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    curr._0_1_ = (char)iVar2 + '0';
    ppcVar1 = &curr;
    while( true ) {
      local_60 = (char **)((long)ppcVar1 + 1);
      lStack_28 = lStack_28 / 10;
      if (lStack_28 == 0) break;
      iVar2 = (int)(lStack_28 % 10);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      *(char *)local_60 = (char)iVar2 + '0';
      ppcVar1 = local_60;
    }
    if (bVar3) {
      *(char *)local_60 = '-';
      local_60 = (char **)((long)ppcVar1 + 2);
    }
    NVar4 = AllocArray(1,((int)local_60 - (int)&curr) + 1,2);
    str = NVar4.ptr;
    local_78 = NVar4.len;
    stack0xffffffffffffffec = str;
    arr.ptr._0_4_ = local_78;
    local_88 = str;
    do {
      local_60 = (char **)((long)local_60 + -1);
      *local_88 = *(char *)local_60;
      local_88 = local_88 + 1;
    } while (local_60 != &curr);
  }
  NVar4.len = (uint)arr.ptr;
  NVar4.ptr = stack0xffffffffffffffec;
  return NVar4;
}

Assistant:

NULLCArray NULLC::LongToStr(long long* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	long long number = *r;
	bool sign = 0;
	char buf[32];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(int(number % 10)) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(int(number % 10)) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}